

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O3

void __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::option_with_value(option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,string *name,char short_name,bool need,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def,
                   string *desc)

{
  pointer pcVar1;
  string local_50;
  
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_with_value_00145488;
  (this->nam)._M_dataplus._M_p = (pointer)&(this->nam).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->nam,pcVar1,pcVar1 + name->_M_string_length);
  this->snam = short_name;
  this->need = need;
  (this->desc)._M_dataplus._M_p = (pointer)&(this->desc).field_2;
  (this->desc)._M_string_length = 0;
  (this->desc).field_2._M_local_buf[0] = '\0';
  this->has = false;
  (this->def)._M_dataplus._M_p = (pointer)&(this->def).field_2;
  pcVar1 = (def->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->def,pcVar1,pcVar1 + def->_M_string_length);
  (this->actual)._M_dataplus._M_p = (pointer)&(this->actual).field_2;
  pcVar1 = (def->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->actual,pcVar1,pcVar1 + def->_M_string_length);
  full_description(&local_50,this,desc);
  std::__cxx11::string::operator=((string *)&this->desc,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

option_with_value(const std::string &name, char short_name, bool need, const T &def, const std::string &desc)
				: nam(name), snam(short_name), need(need), has(false), def(def), actual(def)
			{
				this->desc = full_description(desc);
			}